

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_rb_struct
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  t_rb_ofstream *ptVar1;
  ostream *poVar2;
  string local_48;
  byte local_21;
  t_struct *ptStack_20;
  bool is_exception_local;
  t_struct *tstruct_local;
  t_rb_ofstream *out_local;
  t_rb_generator *this_local;
  
  local_21 = is_exception;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (t_rb_ofstream *)this;
  generate_rdoc(this,out,(t_doc *)tstruct);
  ptVar1 = t_rb_ofstream::indent((t_rb_ofstream *)tstruct_local);
  poVar2 = std::operator<<((ostream *)ptVar1,"class ");
  type_name_abi_cxx11_(&local_48,this,&ptStack_20->super_t_type);
  std::operator<<(poVar2,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((local_21 & 1) != 0) {
    std::operator<<((ostream *)tstruct_local," < ::Thrift::Exception");
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_up((t_rb_ofstream *)tstruct_local);
  ptVar1 = t_rb_ofstream::indent((t_rb_ofstream *)tstruct_local);
  poVar2 = std::operator<<((ostream *)ptVar1,"include ::Thrift::Struct, ::Thrift::Struct_Union");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if ((local_21 & 1) != 0) {
    generate_rb_simple_exception_constructor(this,(t_rb_ofstream *)tstruct_local,ptStack_20);
  }
  generate_field_constants(this,(t_rb_ofstream *)tstruct_local,ptStack_20);
  generate_field_defns(this,(t_rb_ofstream *)tstruct_local,ptStack_20);
  generate_rb_struct_required_validator(this,(t_rb_ofstream *)tstruct_local,ptStack_20);
  ptVar1 = t_rb_ofstream::indent((t_rb_ofstream *)tstruct_local);
  poVar2 = std::operator<<((ostream *)ptVar1,"::Thrift::Struct.generate_accessors self");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_down((t_rb_ofstream *)tstruct_local);
  ptVar1 = t_rb_ofstream::indent((t_rb_ofstream *)tstruct_local);
  poVar2 = std::operator<<((ostream *)ptVar1,"end");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct(t_rb_ofstream& out,
                                        t_struct* tstruct,
                                        bool is_exception = false) {
  generate_rdoc(out, tstruct);
  out.indent() << "class " << type_name(tstruct);
  if (is_exception) {
    out << " < ::Thrift::Exception";
  }
  out << endl;

  out.indent_up();
  out.indent() << "include ::Thrift::Struct, ::Thrift::Struct_Union" << endl;

  if (is_exception) {
    generate_rb_simple_exception_constructor(out, tstruct);
  }

  generate_field_constants(out, tstruct);
  generate_field_defns(out, tstruct);
  generate_rb_struct_required_validator(out, tstruct);

  out.indent() << "::Thrift::Struct.generate_accessors self" << endl;

  out.indent_down();
  out.indent() << "end" << endl << endl;
}